

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_op.hpp
# Opt level: O2

void __thiscall
asio::detail::reactor_op::reactor_op
          (reactor_op *this,perform_func_type perform_func,func_type complete_func)

{
  (this->super_operation).next_ = (scheduler_operation *)0x0;
  (this->super_operation).func_ = complete_func;
  (this->super_operation).task_result_ = 0;
  std::error_code::error_code(&this->ec_);
  this->bytes_transferred_ = 0;
  this->perform_func_ = perform_func;
  return;
}

Assistant:

reactor_op(perform_func_type perform_func, func_type complete_func)
    : operation(complete_func),
      bytes_transferred_(0),
      perform_func_(perform_func)
  {
  }